

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
::next_impl<0ul,1ul>(void *__return_storage_ptr__,undefined8 *this)

{
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *local_2a8;
  size_t sStack_2a0;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *local_298;
  ptrdiff_t pStack_290;
  BrailleCanvas *local_288;
  block_t *pbStack_280;
  BrailleCanvas *local_278;
  block_t *pbStack_270;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *local_268;
  ptrdiff_t pStack_260;
  BrailleCanvas *local_258;
  block_t *pbStack_250;
  BrailleCanvas *local_248;
  block_t *pbStack_240;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *local_238;
  ptrdiff_t pStack_230;
  BrailleCanvas *local_228;
  block_t *pbStack_220;
  BrailleCanvas *local_218;
  block_t *pbStack_210;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *local_208;
  ptrdiff_t pStack_200;
  BrailleCanvas *local_1f8;
  block_t *pbStack_1f0;
  BrailleCanvas *local_1e8;
  block_t *pbStack_1e0;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  local_1d8;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  local_100;
  
  uVar1 = *this;
  uVar2 = this[1];
  this_00 = (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
             *)(this + 8);
  bVar8 = vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::equal(this_00,(vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                           *)(this + 0x28));
  if (bVar8) {
    memcpy(&local_2a8,this_00,0xd0);
  }
  else {
    memcpy(&local_1d8,this_00,0xd0);
    vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
    ::next(&local_100,&local_1d8);
    local_2a8 = local_100.vbox_;
    sStack_2a0 = local_100.margin_;
    local_278 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.end_.line_.canvas_;
    pbStack_270 = local_100.lines_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.end_.line_.it_._M_current;
    local_288 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.line_.line_.canvas_;
    pbStack_280 = local_100.lines_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.line_.line_.it_._M_current;
    local_298 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.frame_;
    pStack_290 = local_100.lines_.
                 super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                 ._M_head_impl.line_.overflow_;
    local_248 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.end_.line_.canvas_;
    pbStack_240 = local_100.lines_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.end_.line_.it_._M_current;
    local_258 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.line_.line_.canvas_;
    pbStack_250 = local_100.lines_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.line_.line_.it_._M_current;
    local_268 = local_100.lines_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.frame_;
    pStack_260 = local_100.lines_.
                 super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                 ._M_head_impl.line_.overflow_;
    local_218 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.end_.line_.canvas_;
    pbStack_210 = local_100.ends_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.end_.line_.it_._M_current;
    local_228 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.line_.line_.canvas_;
    pbStack_220 = local_100.ends_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.line_.line_.it_._M_current;
    local_238 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.frame_;
    pStack_230 = local_100.ends_.
                 super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                 ._M_head_impl.line_.overflow_;
    local_1e8 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.end_.line_.canvas_;
    pbStack_1e0 = local_100.ends_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.end_.line_.it_._M_current;
    local_1f8 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.line_.line_.canvas_;
    pbStack_1f0 = local_100.ends_.
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.line_.line_.it_._M_current;
    local_208 = local_100.ends_.
                super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                .
                super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                ._M_head_impl.line_.frame_;
    pStack_200 = local_100.ends_.
                 super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                 .
                 super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                 ._M_head_impl.line_.overflow_;
  }
  lVar9 = this[5];
  uVar3 = this[2];
  lVar10 = this[3];
  lVar4 = this[4];
  uVar5 = this[6];
  lVar6 = this[7];
  if ((lVar9 != this[0x25]) || (lVar10 != this[0x23])) {
    if (lVar9 == lVar6 || lVar10 != 0) {
      lVar10 = lVar10 + 1;
    }
    else {
      lVar9 = lVar9 + *(long *)(lVar4 + 8) * 0x14;
    }
  }
  *(undefined8 *)__return_storage_ptr__ = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 8) = uVar2;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = uVar3;
  *(long *)((long)__return_storage_ptr__ + 0x18) = lVar10;
  *(long *)((long)__return_storage_ptr__ + 0x20) = lVar4;
  *(long *)((long)__return_storage_ptr__ + 0x28) = lVar9;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x30) = uVar5;
  *(long *)((long)__return_storage_ptr__ + 0x38) = lVar6;
  *(VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
    **)((long)__return_storage_ptr__ + 0x40) = local_2a8;
  *(size_t *)((long)__return_storage_ptr__ + 0x48) = sStack_2a0;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0x70) = local_278;
  *(block_t **)((long)__return_storage_ptr__ + 0x78) = pbStack_270;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0x60) = local_288;
  *(block_t **)((long)__return_storage_ptr__ + 0x68) = pbStack_280;
  *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)((long)__return_storage_ptr__ + 0x50) =
       local_298;
  *(ptrdiff_t *)((long)__return_storage_ptr__ + 0x58) = pStack_290;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0xa0) = local_248;
  *(block_t **)((long)__return_storage_ptr__ + 0xa8) = pbStack_240;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0x90) = local_258;
  *(block_t **)((long)__return_storage_ptr__ + 0x98) = pbStack_250;
  *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)((long)__return_storage_ptr__ + 0x80) =
       local_268;
  *(ptrdiff_t *)((long)__return_storage_ptr__ + 0x88) = pStack_260;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0xd0) = local_218;
  *(block_t **)((long)__return_storage_ptr__ + 0xd8) = pbStack_210;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0xc0) = local_228;
  *(block_t **)((long)__return_storage_ptr__ + 200) = pbStack_220;
  *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)((long)__return_storage_ptr__ + 0xb0) =
       local_238;
  *(ptrdiff_t *)((long)__return_storage_ptr__ + 0xb8) = pStack_230;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0x100) = local_1e8;
  *(block_t **)((long)__return_storage_ptr__ + 0x108) = pbStack_1e0;
  *(BrailleCanvas **)((long)__return_storage_ptr__ + 0xf0) = local_1f8;
  *(block_t **)((long)__return_storage_ptr__ + 0xf8) = pbStack_1f0;
  *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)((long)__return_storage_ptr__ + 0xe0) =
       local_208;
  *(ptrdiff_t *)((long)__return_storage_ptr__ + 0xe8) = pStack_200;
  uVar1 = this[0x22];
  uVar2 = this[0x23];
  uVar3 = this[0x24];
  uVar5 = this[0x25];
  uVar7 = this[0x27];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x130) = this[0x26];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x138) = uVar7;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x120) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x128) = uVar5;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x110) = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x118) = uVar2;
  uVar1 = this[0x29];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x140) = this[0x28];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x148) = uVar1;
  uVar1 = this[0x2a];
  uVar2 = this[0x2b];
  uVar3 = this[0x2c];
  uVar5 = this[0x2d];
  uVar7 = this[0x2f];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x170) = this[0x2e];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x178) = uVar7;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x160) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x168) = uVar5;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x150) = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x158) = uVar2;
  uVar1 = this[0x30];
  uVar2 = this[0x31];
  uVar3 = this[0x32];
  uVar5 = this[0x33];
  uVar7 = this[0x35];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1a0) = this[0x34];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1a8) = uVar7;
  *(undefined8 *)((long)__return_storage_ptr__ + 400) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x198) = uVar5;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x180) = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x188) = uVar2;
  uVar1 = this[0x36];
  uVar2 = this[0x37];
  uVar3 = this[0x38];
  uVar5 = this[0x39];
  uVar7 = this[0x3b];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1d0) = this[0x3a];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1d8) = uVar7;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1c0) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1c8) = uVar5;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1b0) = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1b8) = uVar2;
  uVar1 = this[0x3c];
  uVar2 = this[0x3d];
  uVar3 = this[0x3e];
  uVar5 = this[0x3f];
  uVar7 = this[0x41];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x200) = this[0x40];
  *(undefined8 *)((long)__return_storage_ptr__ + 0x208) = uVar7;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1f0) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1f8) = uVar5;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1e0) = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x1e8) = uVar2;
  return (hbox_line<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          *)__return_storage_ptr__;
}

Assistant:

hbox_line next_impl(std::index_sequence<N...>) const {
            return {
                hbox_,
                margin_,
                block_iterators{
                    ((std::get<N>(lines_) != std::get<N>(ends_)) ? std::next(std::get<N>(lines_)) : std::get<N>(lines_))... },
                ends_
            };
        }